

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> __thiscall
anon_unknown.dwarf_58494::ParserImpl::ParsePrefixExp(ParserImpl *this,PrefixExpType *type)

{
  undefined8 uVar1;
  TokenDetail *pTVar2;
  undefined4 *in_RDX;
  long in_RSI;
  __uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true> in_RDI;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> exp;
  int in_stack_0000010c;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *in_stack_00000110;
  ParserImpl *in_stack_00000118;
  undefined1 in_stack_00000130 [32];
  anon_union_8_2_010d16d7_for_TokenDetail_0 in_stack_ffffffffffffff28;
  ParserImpl *in_stack_ffffffffffffff30;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *in_stack_ffffffffffffff40;
  anon_union_8_2_010d16d7_for_TokenDetail_0 in_stack_ffffffffffffffa0;
  anon_union_8_2_010d16d7_for_TokenDetail_0 t;
  ParserImpl *in_stack_ffffffffffffffa8;
  ParserImpl *str;
  ParseException *in_stack_ffffffffffffffb0;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *in_stack_ffffffffffffffb8;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *in_stack_ffffffffffffffc0;
  ParserImpl *in_stack_ffffffffffffffc8;
  
  NextToken(in_stack_ffffffffffffff30);
  if ((*(int *)(in_RSI + 0x20) != 0x115) && (*(int *)(in_RSI + 0x20) != 0x28)) {
    uVar1 = __cxa_allocate_exception(0x20);
    luna::ParseException::ParseException
              (in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8,
               (TokenDetail *)in_stack_ffffffffffffffa0.str_);
    __cxa_throw(uVar1,&luna::ParseException::typeinfo,luna::ParseException::~ParseException);
  }
  std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>::
  unique_ptr<std::default_delete<luna::SyntaxTree>,void>
            ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
             in_stack_ffffffffffffff30);
  if (*(int *)(in_RSI + 0x20) == 0x28) {
    std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>::
    unique_ptr<std::default_delete<luna::SyntaxTree>,void>
              ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
               in_stack_ffffffffffffff30);
    in_stack_ffffffffffffff28 = in_stack_ffffffffffffffa0;
    in_stack_ffffffffffffff30 = in_stack_ffffffffffffffa8;
    in_stack_ffffffffffffff40 = in_stack_ffffffffffffffb8;
    luna::TokenDetail::TokenDetail((TokenDetail *)&stack0xffffffffffffffa0);
    t = in_stack_ffffffffffffff28;
    str = in_stack_ffffffffffffff30;
    in_stack_ffffffffffffffb8 = in_stack_ffffffffffffff40;
    ParseExp(in_stack_00000118,in_stack_00000110,(TokenDetail)in_stack_00000130,in_stack_0000010c);
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator=
              ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
               in_stack_ffffffffffffff30,
               (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
               in_stack_ffffffffffffff28.str_);
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
              (in_stack_ffffffffffffff40);
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
              (in_stack_ffffffffffffff40);
    pTVar2 = NextToken(in_stack_ffffffffffffff30);
    if (pTVar2->token_ != 0x29) {
      uVar1 = __cxa_allocate_exception(0x20);
      luna::ParseException::ParseException
                (in_stack_ffffffffffffffb0,(char *)str,(TokenDetail *)t.str_);
      __cxa_throw(uVar1,&luna::ParseException::typeinfo,luna::ParseException::~ParseException);
    }
    if (in_RDX != (undefined4 *)0x0) {
      *in_RDX = 0;
    }
  }
  else {
    operator_new(0x30);
    luna::Terminator::Terminator
              ((Terminator *)in_stack_ffffffffffffff30,(TokenDetail *)in_stack_ffffffffffffff28.str_
              );
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::reset
              ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
               in_stack_ffffffffffffff30,(pointer)in_stack_ffffffffffffff28.str_);
    if (in_RDX != (undefined4 *)0x0) {
      *in_RDX = 1;
    }
  }
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::unique_ptr
            ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
             in_stack_ffffffffffffff30,
             (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
             in_stack_ffffffffffffff28.str_);
  ParsePrefixExpTail(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                     (PrefixExpType *)in_stack_ffffffffffffffb8);
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
            (in_stack_ffffffffffffff40);
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
            (in_stack_ffffffffffffff40);
  return (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
         (tuple<luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>)
         in_RDI.super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t
         .super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
         super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<SyntaxTree> ParsePrefixExp(PrefixExpType *type = nullptr)
        {
            NextToken();
            if (current_.token_ != Token_Id && current_.token_ != '(')
                throw ParseException("unexpect token here", current_);

            std::unique_ptr<SyntaxTree> exp;

            if (current_.token_ == '(')
            {
                exp = ParseExp();
                if (NextToken().token_ != ')')
                    throw ParseException("expect ')'", current_);
                if (type) *type = PrefixExpType_Normal;
            }
            else
            {
                exp.reset(new Terminator(current_));
                if (type) *type = PrefixExpType_Var;
            }

            return ParsePrefixExpTail(std::move(exp), type);
        }